

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c++
# Opt level: O3

EncodingResult<kj::Array<char32_t>_> * __thiscall
kj::encodeUtf32(EncodingResult<kj::Array<char32_t>_> *__return_storage_ptr__,kj *this,
               ArrayPtr<const_char> text,bool nulTerminate)

{
  char *pcVar1;
  kj kVar2;
  char32_t *pcVar3;
  char *pcVar4;
  bool bVar5;
  char *pcVar6;
  size_t sVar7;
  kj *pkVar8;
  ulong uVar9;
  Vector<char32_t> local_70;
  kj *local_50;
  uint local_44;
  char32_t *local_40;
  EncodingResult<kj::Array<char32_t>_> *local_38;
  
  pcVar4 = text.ptr;
  local_44 = (uint)text.size_;
  uVar9 = (ulong)local_44;
  bVar5 = false;
  local_50 = this;
  local_38 = __return_storage_ptr__;
  local_70.builder.ptr =
       (char32_t *)
       _::HeapArrayDisposer::allocateImpl
                 (4,0,(size_t)(pcVar4 + uVar9),(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0
                 );
  pcVar3 = local_70.builder.ptr + (long)(pcVar4 + uVar9);
  local_70.builder.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  local_70.builder.pos = local_70.builder.ptr;
  local_70.builder.endPtr = pcVar3;
  if (pcVar4 != (char *)0x0) {
    local_40 = (char32_t *)0x0;
    pcVar6 = (char *)0x0;
    pkVar8 = local_50;
    do {
      pcVar1 = pcVar6 + 1;
      kVar2 = pkVar8[(long)pcVar6];
      pcVar6 = pcVar1;
      if ((char)kVar2 < '\0') {
        if (0xbf < (byte)kVar2) {
          if ((byte)kVar2 < 0xe0) {
            pcVar6 = pcVar4;
            if (pcVar1 != pcVar4) {
              pcVar3 = (char32_t *)0x0;
              pcVar6 = pcVar1;
            }
          }
          else if ((byte)kVar2 < 0xf0) {
            pcVar6 = pcVar4;
            if (pcVar1 != pcVar4) {
              pcVar3 = (char32_t *)0x0;
              pcVar6 = pcVar1;
            }
          }
          else {
            pcVar3 = (char32_t *)CONCAT71((int7)((ulong)pcVar3 >> 8),0xf7 < (byte)kVar2);
            if (pcVar1 != pcVar4 && 0xf7 >= (byte)kVar2) {
              pcVar3 = (char32_t *)0x0;
            }
          }
        }
        if (local_70.builder.pos == local_70.builder.endPtr) {
          sVar7 = (long)local_70.builder.pos - (long)local_70.builder.ptr >> 1;
          if (local_70.builder.pos == local_70.builder.ptr) {
            sVar7 = 4;
          }
          pcVar3 = local_70.builder.ptr;
          Vector<char32_t>::setCapacity(&local_70,sVar7);
          pkVar8 = local_50;
        }
        *local_70.builder.pos = L'�';
        if (pcVar6 < pcVar4) {
          pcVar3 = (char32_t *)((ulong)pcVar3 & 0xffffffffffffff00);
        }
        pcVar3 = (char32_t *)CONCAT71((int7)((ulong)pcVar3 >> 8),1);
        local_40 = pcVar3;
      }
      else {
        if (local_70.builder.pos == local_70.builder.endPtr) {
          sVar7 = (long)local_70.builder.pos - (long)local_70.builder.ptr >> 1;
          if (local_70.builder.pos == local_70.builder.ptr) {
            sVar7 = 4;
          }
          pcVar3 = local_70.builder.ptr;
          Vector<char32_t>::setCapacity(&local_70,sVar7);
          pkVar8 = local_50;
        }
        *local_70.builder.pos = (int)(char)kVar2;
      }
      local_70.builder.pos = local_70.builder.pos + 1;
    } while (pcVar6 < pcVar4);
    bVar5 = (bool)((byte)local_40 & 1);
  }
  if ((char)local_44 != '\0') {
    if (local_70.builder.pos == local_70.builder.endPtr) {
      sVar7 = 4;
      if (local_70.builder.endPtr != local_70.builder.ptr) {
        sVar7 = (long)local_70.builder.endPtr - (long)local_70.builder.ptr >> 1;
      }
      Vector<char32_t>::setCapacity(&local_70,sVar7);
    }
    *local_70.builder.pos = L'\0';
    local_70.builder.pos = local_70.builder.pos + 1;
  }
  if (local_70.builder.pos != local_70.builder.endPtr) {
    Vector<char32_t>::setCapacity
              (&local_70,(long)local_70.builder.pos - (long)local_70.builder.ptr >> 2);
    local_70.builder.endPtr = local_70.builder.pos;
  }
  (local_38->super_Array<char32_t>).ptr = local_70.builder.ptr;
  (local_38->super_Array<char32_t>).size_ =
       (long)local_70.builder.endPtr - (long)local_70.builder.ptr >> 2;
  (local_38->super_Array<char32_t>).disposer = local_70.builder.disposer;
  local_38->hadErrors = bVar5;
  return local_38;
}

Assistant:

EncodingResult<Array<char32_t>> encodeUtf32(ArrayPtr<const char> text, bool nulTerminate) {
  return encodeUtf<char32_t>(text, nulTerminate);
}